

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

CURLcode cpfds_add_sock(curl_pollfds *cpfds,curl_socket_t sock,short events,_Bool fold)

{
  CURLcode CVar1;
  uint local_24;
  int i;
  _Bool fold_local;
  short events_local;
  curl_socket_t sock_local;
  curl_pollfds *cpfds_local;
  
  if ((fold) && (cpfds->n < 0x80000000)) {
    local_24 = cpfds->n;
    do {
      local_24 = local_24 - 1;
      if ((int)local_24 < 0) goto LAB_001791f9;
    } while (sock != cpfds->pfds[(int)local_24].fd);
    cpfds->pfds[(int)local_24].events = cpfds->pfds[(int)local_24].events | events;
    cpfds_local._4_4_ = CURLE_OK;
  }
  else {
LAB_001791f9:
    if ((cpfds->n < cpfds->count) || (CVar1 = cpfds_increase(cpfds,100), CVar1 == CURLE_OK)) {
      cpfds->pfds[cpfds->n].fd = sock;
      cpfds->pfds[cpfds->n].events = events;
      cpfds->n = cpfds->n + 1;
      cpfds_local._4_4_ = CURLE_OK;
    }
    else {
      cpfds_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return cpfds_local._4_4_;
}

Assistant:

static CURLcode cpfds_add_sock(struct curl_pollfds *cpfds,
                               curl_socket_t sock, short events, bool fold)
{
  int i;

  if(fold && cpfds->n <= INT_MAX) {
    for(i = (int)cpfds->n - 1; i >= 0; --i) {
      if(sock == cpfds->pfds[i].fd) {
        cpfds->pfds[i].events |= events;
        return CURLE_OK;
      }
    }
  }
  /* not folded, add new entry */
  if(cpfds->n >= cpfds->count) {
    if(cpfds_increase(cpfds, 100))
      return CURLE_OUT_OF_MEMORY;
  }
  cpfds->pfds[cpfds->n].fd = sock;
  cpfds->pfds[cpfds->n].events = events;
  ++cpfds->n;
  return CURLE_OK;
}